

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void handle_filter_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,
               RD_STATS *rd_stats_y,int mode_cost,int64_t best_rd,int64_t best_rd_so_far)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_RCX;
  long in_RSI;
  void *in_R8;
  long in_stack_00000008;
  int64_t this_rd_tmp;
  int this_rate_tmp;
  FILTER_INTRA_MODE fi_mode;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  FILTER_INTRA_MODE best_fi_mode;
  TX_SIZE best_tx_size;
  int filter_intra_selected_flag;
  RD_STATS rd_stats_y_fi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  byte local_879;
  undefined1 local_878 [56];
  int64_t in_stack_fffffffffffff7c0;
  BLOCK_SIZE in_stack_fffffffffffff7cf;
  RD_STATS *in_stack_fffffffffffff7d0;
  MACROBLOCK *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  int in_stack_fffffffffffff7e4;
  int in_stack_fffffffffffff7e8;
  BLOCK_SIZE in_stack_fffffffffffff7ef;
  MB_MODE_INFO *in_stack_fffffffffffff7f0;
  MACROBLOCK *in_stack_fffffffffffff7f8;
  AV1_COMP *in_stack_fffffffffffff800;
  undefined1 local_478 [1034];
  byte local_6e;
  undefined1 local_6d;
  int local_6c;
  int local_68 [2];
  long local_60;
  long local_40;
  long local_38;
  void *local_28;
  long local_20;
  long local_10;
  
  local_38 = in_RSI + 0x1a0;
  local_40 = **(long **)(in_RSI + 0x2058);
  local_6c = 0;
  local_6d = *(undefined1 *)(local_40 + 0x91);
  local_6e = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  memcpy(local_478,(void *)(in_RSI + 0x24e09),(long)*(int *)(in_RCX + 0x1a0));
  memcpy(local_878,*(void **)(local_38 + 0x1ee8),(long)*(int *)(local_20 + 0x1a0));
  *(undefined1 *)(local_40 + 0x5b) = 1;
  for (local_879 = 0; local_879 < 5; local_879 = local_879 + 1) {
    *(byte *)(local_40 + 0x5a) = local_879;
    av1_pick_uniform_tx_size_type_yrd
              ((AV1_COMP *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
               in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cf,
               in_stack_fffffffffffff7c0);
    iVar1 = local_68[0];
    if (local_68[0] != 0x7fffffff) {
      iVar2 = intra_mode_info_cost_y
                        (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                         in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ef,
                         in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4);
      lVar3 = ((long)(iVar1 + iVar2) * (long)*(int *)(local_10 + 0x4218) + 0x100 >> 9) +
              local_60 * 0x80;
      if ((lVar3 != 0x7fffffffffffffff) && (in_stack_00000008 < lVar3 / 2)) break;
      if (lVar3 < this_rd_tmp) {
        local_6d = *(undefined1 *)(local_40 + 0x91);
        memcpy(local_878,*(void **)(local_38 + 0x1ee8),(long)*(int *)(local_20 + 0x1a0));
        memcpy(local_478,(void *)(local_10 + 0x24e09),(long)*(int *)(local_20 + 0x1a0));
        local_6e = local_879;
        memcpy(local_28,local_68,0x28);
        local_6c = 1;
        this_rd_tmp = lVar3;
      }
    }
  }
  *(undefined1 *)(local_40 + 0x91) = local_6d;
  memcpy(*(void **)(local_38 + 0x1ee8),local_878,(long)*(int *)(local_20 + 0x1a0));
  memcpy((void *)(local_10 + 0x24e09),local_478,(long)*(int *)(local_20 + 0x1a0));
  if (local_6c == 0) {
    *(undefined1 *)(local_40 + 0x5b) = 0;
  }
  else {
    *(undefined1 *)(local_40 + 0x5b) = 1;
    *(byte *)(local_40 + 0x5a) = local_6e;
  }
  return;
}

Assistant:

static inline void handle_filter_intra_mode(const AV1_COMP *cpi, MACROBLOCK *x,
                                            BLOCK_SIZE bsize,
                                            const PICK_MODE_CONTEXT *ctx,
                                            RD_STATS *rd_stats_y, int mode_cost,
                                            int64_t best_rd,
                                            int64_t best_rd_so_far) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->mode == DC_PRED &&
         av1_filter_intra_allowed_bsize(&cpi->common, bsize));

  RD_STATS rd_stats_y_fi;
  int filter_intra_selected_flag = 0;
  TX_SIZE best_tx_size = mbmi->tx_size;
  FILTER_INTRA_MODE best_fi_mode = FILTER_DC_PRED;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  memcpy(best_blk_skip, x->txfm_search_info.blk_skip,
         sizeof(best_blk_skip[0]) * ctx->num_4x4_blk);
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  av1_copy_array(best_tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
  mbmi->filter_intra_mode_info.use_filter_intra = 1;
  for (FILTER_INTRA_MODE fi_mode = FILTER_DC_PRED; fi_mode < FILTER_INTRA_MODES;
       ++fi_mode) {
    mbmi->filter_intra_mode_info.filter_intra_mode = fi_mode;
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &rd_stats_y_fi, bsize, best_rd);
    if (rd_stats_y_fi.rate == INT_MAX) continue;
    const int this_rate_tmp =
        rd_stats_y_fi.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
    const int64_t this_rd_tmp =
        RDCOST(x->rdmult, this_rate_tmp, rd_stats_y_fi.dist);

    if (this_rd_tmp != INT64_MAX && this_rd_tmp / 2 > best_rd) {
      break;
    }
    if (this_rd_tmp < best_rd_so_far) {
      best_tx_size = mbmi->tx_size;
      av1_copy_array(best_tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
      memcpy(best_blk_skip, x->txfm_search_info.blk_skip,
             sizeof(best_blk_skip[0]) * ctx->num_4x4_blk);
      best_fi_mode = fi_mode;
      *rd_stats_y = rd_stats_y_fi;
      filter_intra_selected_flag = 1;
      best_rd_so_far = this_rd_tmp;
    }
  }

  mbmi->tx_size = best_tx_size;
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);

  if (filter_intra_selected_flag) {
    mbmi->filter_intra_mode_info.use_filter_intra = 1;
    mbmi->filter_intra_mode_info.filter_intra_mode = best_fi_mode;
  } else {
    mbmi->filter_intra_mode_info.use_filter_intra = 0;
  }
}